

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

void __thiscall cfd::core::ScriptElement::ScriptElement(ScriptElement *this,ScriptOperator *op_code)

{
  ScriptType SVar1;
  int64_t base_value;
  ScriptType type;
  ScriptOperator *op_code_local;
  ScriptElement *this_local;
  
  this->_vptr_ScriptElement = (_func_int **)&PTR__ScriptElement_0088b7c8;
  this->type_ = kElementOpCode;
  ScriptOperator::ScriptOperator(&this->op_code_,op_code);
  ByteData::ByteData(&this->binary_data_);
  this->value_ = 0;
  SVar1 = ScriptOperator::GetDataType(op_code);
  if ((SVar1 == kOp1Negate) || ((0x50 < (int)SVar1 && ((int)SVar1 < 0x61)))) {
    this->value_ = (ulong)SVar1 - 0x50;
  }
  return;
}

Assistant:

ScriptElement::ScriptElement(const ScriptOperator& op_code)
    : type_(kElementOpCode), op_code_(op_code), binary_data_(), value_(0) {
  ScriptType type = op_code.GetDataType();
  if ((type == kOp1Negate) || ((type >= kOp_1) && (type <= kOp_16))) {
    // convert to numeric format
    int64_t base_value = static_cast<int64_t>(kOp_1) - 1;
    value_ = static_cast<int64_t>(type) - base_value;
  }
}